

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::RobustBufferAccessBehavior::StorageBufferTest::iterate(StorageBufferTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 uVar4;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  char *__end;
  Buffer destination_buffer;
  Buffer source_buffer;
  Program program;
  Buffer local_190;
  Buffer local_178;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  Program local_a0;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_test_case != LAST) {
    do {
      local_190.m_context = (this->super_TestCase).m_context;
      local_190.m_id = 0xffffffff;
      local_190.m_target = 0x8892;
      local_178.m_id = 0xffffffff;
      local_178.m_target = 0x8892;
      local_a0.m_id = 0;
      local_a0.m_compute.m_id = 0;
      local_a0.m_fragment.m_id = 0;
      local_a0.m_geometry.m_id = 0;
      local_a0.m_tess_ctrl.m_id = 0;
      local_a0.m_tess_eval.m_id = 0;
      local_a0.m_vertex.m_id = 0;
      local_178.m_context = local_190.m_context;
      local_a0.m_compute.m_context = local_190.m_context;
      local_a0.m_fragment.m_context = local_190.m_context;
      local_a0.m_geometry.m_context = local_190.m_context;
      local_a0.m_tess_ctrl.m_context = local_190.m_context;
      local_a0.m_tess_eval.m_context = local_190.m_context;
      local_a0.m_vertex.m_context = local_190.m_context;
      local_a0.m_context = local_190.m_context;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_c0,this);
      RobustBufferAccessBehavior::Buffer::InitData
                (&local_190,0x90d2,0x88ea,0x10,iterate::destination_data);
      RobustBufferAccessBehavior::Buffer::InitData
                (&local_178,0x90d2,0x88ea,0x10,iterate::source_data);
      iVar1 = (*(local_190.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x48))(local_190.m_target,0,local_190.m_id);
      dVar2 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
      glu::checkError(dVar2,"BindBufferBase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0x9d);
      iVar1 = (*(local_178.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x48))(local_178.m_target,1,local_178.m_id);
      dVar2 = (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x800))();
      glu::checkError(dVar2,"BindBufferBase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0x9d);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,0x1af8059,0x1af8059);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,0x1af8059,0x1af8059);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,0x1af8059,0x1af8059);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,0x1af8059,0x1af8059);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,0x1af8059,0x1af8059);
      RobustBufferAccessBehavior::Program::Init
                (&local_a0,&local_c0,&local_100,&local_120,&local_140,&local_160,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      iVar1 = (*(local_a0.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x1680))(local_a0.m_id);
      dVar2 = (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x800))();
      glu::checkError(dVar2,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0x1db);
      (**(code **)(lVar3 + 0x528))(1,1,1);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"DispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0xd10);
      (**(code **)(lVar3 + 0xdb8))(0xffffffff);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"MemoryBarrier",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0xd14);
      iVar1 = (*(local_190.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x40))(local_190.m_target,local_190.m_id);
      dVar2 = (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x800))();
      glu::checkError(dVar2,"BindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0x90);
      uVar4 = (**(code **)(lVar3 + 0xd00))(0x90d2,0,0x10,1);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"MapBufferRange",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0xd1a);
      iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this,uVar4);
      (**(code **)(lVar3 + 0x1670))(0x90d2);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"UnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,0xd1f);
      this->m_test_case = this->m_test_case + SOURCE_INVALID;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      RobustBufferAccessBehavior::Program::~Program(&local_a0);
      RobustBufferAccessBehavior::Buffer::~Buffer(&local_178);
      RobustBufferAccessBehavior::Buffer::~Buffer(&local_190);
    } while (this->m_test_case != LAST);
    if ((char)iVar1 == '\0') {
      this_00 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00d99016;
    }
  }
  this_00 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00d99016:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageBufferTest::iterate()
{
	static const GLfloat destination_data[4] = { 1.0f, 1.0f, 1.0f, 1.0f };
	static const GLfloat source_data[4]		 = { 2.0f, 3.0f, 4.0f, 5.0f };

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	while (LAST != m_test_case)
	{
		/* Test case objects */
		Buffer  destination_buffer(m_context);
		Buffer  source_buffer(m_context);
		Program program(m_context);

		/* Compute Shader */
		const std::string& cs = getComputeShader();

		/* Buffers initialization */
		destination_buffer.InitData(GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(destination_data),
									destination_data);
		source_buffer.InitData(GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(source_data), source_data);

		destination_buffer.BindBase(0);
		source_buffer.BindBase(1);

		/* Shaders initialization */
		program.Init(cs, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);
		program.Use();

		/* Dispatch compute */
		gl.dispatchCompute(1 /* x */, 1 /* y */, 1 /* z */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Set memory barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Verify results */
		destination_buffer.Bind();
		GLfloat* buffer_data =
			(GLfloat*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(destination_data), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBufferRange");

		test_result = verifyResults(buffer_data);

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		/* Increment */
		m_test_case = (VERSION)((GLuint)m_test_case + 1);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}